

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O0

void __thiscall UnifiedRegex::CountDomain::Mult(CountDomain *this,CountDomain *other)

{
  CharCount maxOther_1;
  CharCount maxOther;
  CountDomain *other_local;
  CountDomain *this_local;
  
  if (this->lower != 0) {
    if ((uint)(0x7ffffffe / (ulong)this->lower) < other->lower) {
      this->lower = 0x7ffffffe;
    }
    else {
      this->lower = other->lower * this->lower;
    }
  }
  if ((this->upper != 0) && (this->upper != 0xffffffff)) {
    if (other->upper == 0xffffffff) {
      this->upper = 0xffffffff;
    }
    else if ((uint)(0x7ffffffe / (ulong)this->upper) < other->upper) {
      this->upper = 0xffffffff;
    }
    else {
      this->upper = other->upper * this->upper;
    }
  }
  return;
}

Assistant:

inline void Mult(const CountDomain& other)
        {
            if (lower != 0)
            {
                CharCount maxOther = MaxCharCount / lower;
                if (other.lower > maxOther)
                    // Clip to maximum
                    lower = MaxCharCount;
                else
                    lower *= other.lower;
            }
            if (upper != 0 && upper != CharCountFlag)
            {
                if (other.upper == CharCountFlag)
                    upper = CharCountFlag;
                else
                {
                    CharCount maxOther = MaxCharCount / upper;
                    if (other.upper > maxOther)
                        // Clip to 'unbounded'
                        upper = CharCountFlag;
                    else
                        upper *= other.upper;
                }
            }
        }